

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::CordFieldGenerator::
GenerateMemberConstexprConstructor(CordFieldGenerator *this,Printer *p)

{
  bool bVar1;
  anon_class_1_0_00000001 local_f9;
  string local_f8;
  char *local_d8;
  Sub local_d0;
  
  if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ !=
      (string *)0x0) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Split","");
    bVar1 = ShouldSplit((this->super_FieldGeneratorBase).field_,
                        (this->super_FieldGeneratorBase).options_);
    local_d8 = anon_var_dwarf_a22956 + 5;
    if (bVar1) {
      local_d8 = "Split::";
    }
    io::Printer::Sub::Sub<char_const*>(&local_d0,&local_f8,&local_d8);
    io::Printer::Emit(p,&local_d0,1,0x69,
                      "$name$_{::absl::strings_internal::MakeStringConstant($classname$::Impl_::$Split$_default_$name$_func_{})}"
                     );
    if (local_d0.annotation_.
        super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
        _M_payload.
        super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
        .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
        true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 &local_d0.annotation_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.value_.consume_after._M_dataplus._M_p != &local_d0.value_.consume_after.field_2)
    {
      operator_delete(local_d0.value_.consume_after._M_dataplus._M_p,
                      local_d0.value_.consume_after.field_2._M_allocated_capacity + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr
      [local_d0.value_.value.
       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
       .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       _M_index]._M_data)(&local_f9,&local_d0.value_.value);
    local_d0.value_.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index
         = 0xff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.key_._M_dataplus._M_p != &local_d0.key_.field_2) {
      operator_delete(local_d0.key_._M_dataplus._M_p,local_d0.key_.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  io::Printer::Emit(p,0,0,9,"$name$_{}");
  return;
}

Assistant:

void GenerateMemberConstexprConstructor(io::Printer* p) const override {
    if (field_->default_value_string().empty()) {
      p->Emit("$name$_{}");
    } else {
      p->Emit({{"Split", ShouldSplit(field_, options_) ? "Split::" : ""}},
              "$name$_{::absl::strings_internal::MakeStringConstant("
              "$classname$::Impl_::$Split$_default_$name$_func_{})}");
    }
  }